

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O0

void __thiscall Dashel::UDPSocketStream::receive(UDPSocketStream *this,IPV4Address *source)

{
  _func_int *p_Var1;
  uint16_t prt;
  uint32_t addr_00;
  int *piVar2;
  uchar *__last;
  IPV4Address local_1080;
  _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> local_1078;
  iterator local_1058;
  size_type local_1038;
  ssize_t recvCount;
  undefined1 local_1028 [4];
  socklen_t addrLen;
  sockaddr_in addr;
  uchar buf [4096];
  IPV4Address *source_local;
  UDPSocketStream *this_local;
  
  recvCount._4_4_ = 0x10;
  local_1038 = recvfrom(*(int *)&(this->super_MemoryPacketStream).super_PacketStream.field_0x78,
                        addr.sin_zero,0x1000,0,(sockaddr *)local_1028,
                        (socklen_t *)((long)&recvCount + 4));
  if ((long)local_1038 < 1) {
    p_Var1 = (this->super_MemoryPacketStream).super_PacketStream._vptr_PacketStream[-3];
    piVar2 = __errno_location();
    Stream::fail((Stream *)
                 ((long)&(this->super_MemoryPacketStream).super_PacketStream._vptr_PacketStream +
                 (long)p_Var1),ConnectionLost,*piVar2,"UDP Socket read I/O error.");
  }
  std::deque<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)
             &(this->super_MemoryPacketStream).super_PacketStream.field_0x20,local_1038);
  __last = addr.sin_zero + local_1038;
  std::deque<unsigned_char,_std::allocator<unsigned_char>_>::begin
            (&local_1058,
             (deque<unsigned_char,_std::allocator<unsigned_char>_> *)
             &(this->super_MemoryPacketStream).super_PacketStream.field_0x20);
  std::copy<unsigned_char*,std::_Deque_iterator<unsigned_char,unsigned_char&,unsigned_char*>>
            (&local_1078,addr.sin_zero,__last,&local_1058);
  addr_00 = ntohl(addrLen);
  prt = ntohs(local_1028._2_2_);
  IPV4Address::IPV4Address(&local_1080,addr_00,prt);
  source->address = local_1080.address;
  source->port = local_1080.port;
  return;
}

Assistant:

virtual void receive(IPV4Address& source)
		{
			unsigned char buf[4096];
			sockaddr_in addr;
			socklen_t addrLen = sizeof(addr);
			ssize_t recvCount = recvfrom(fd, buf, 4096, 0, (struct sockaddr*)&addr, &addrLen);
			if (recvCount <= 0)
				fail(DashelException::ConnectionLost, errno, "UDP Socket read I/O error.");

			receptionBuffer.resize(recvCount);
			std::copy(buf, buf + recvCount, receptionBuffer.begin());

			source = IPV4Address(ntohl(addr.sin_addr.s_addr), ntohs(addr.sin_port));
		}